

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdom.cpp
# Opt level: O0

QDomNodePrivate * __thiscall
QDomNodePrivate::insertAfter
          (QDomNodePrivate *this,QDomNodePrivate *newChild,QDomNodePrivate *refChild)

{
  bool bVar1;
  QDomNodePrivate *pQVar2;
  QDomDocumentPrivate *pQVar3;
  QDomNodePrivate *in_RDX;
  QDomNodePrivate *in_RSI;
  QDomNodePrivate *in_RDI;
  QDomNodePrivate *n;
  QDomDocumentPrivate *doc;
  QDomNodePrivate *local_30;
  QDomNodePrivate *in_stack_ffffffffffffffd8;
  QDomNodePrivate *local_8;
  
  if (in_RSI == (QDomNodePrivate *)0x0) {
    local_8 = (QDomNodePrivate *)0x0;
  }
  else if (in_RSI == in_RDX) {
    local_8 = (QDomNodePrivate *)0x0;
  }
  else if ((in_RDX == (QDomNodePrivate *)0x0) || (pQVar2 = parent(in_RDX), pQVar2 == in_RDI)) {
    pQVar3 = ownerDocument(in_stack_ffffffffffffffd8);
    if (pQVar3 != (QDomDocumentPrivate *)0x0) {
      pQVar3->nodeListTime = pQVar3->nodeListTime + 1;
    }
    bVar1 = isDocumentFragment((QDomNodePrivate *)0x10f380);
    local_8 = in_RSI;
    if (bVar1) {
      if (in_RSI->first != (QDomNodePrivate *)0x0) {
        for (local_30 = in_RSI->first; local_30 != (QDomNodePrivate *)0x0; local_30 = local_30->next
            ) {
          setParent(local_30,in_RDI);
        }
        if ((in_RDX == (QDomNodePrivate *)0x0) || (in_RDX->next == (QDomNodePrivate *)0x0)) {
          if (in_RDI->last != (QDomNodePrivate *)0x0) {
            in_RDI->last->next = in_RSI->first;
          }
          in_RSI->first->prev = in_RDI->last;
          if (in_RDI->first == (QDomNodePrivate *)0x0) {
            in_RDI->first = in_RSI->first;
          }
          in_RDI->last = in_RSI->last;
        }
        else {
          in_RSI->first->prev = in_RDX;
          in_RSI->last->next = in_RDX->next;
          in_RDX->next->prev = in_RSI->last;
          in_RDX->next = in_RSI->first;
        }
        in_RSI->first = (QDomNodePrivate *)0x0;
        in_RSI->last = (QDomNodePrivate *)0x0;
      }
    }
    else {
      pQVar2 = parent(in_RSI);
      if (pQVar2 != (QDomNodePrivate *)0x0) {
        pQVar2 = parent(in_RSI);
        (*pQVar2->_vptr_QDomNodePrivate[6])(pQVar2,in_RSI);
      }
      QBasicAtomicInteger<int>::ref((QBasicAtomicInteger<int> *)0x10f4fb);
      setParent(in_RSI,in_RDI);
      if (in_RDX == (QDomNodePrivate *)0x0) {
        if (in_RDI->last != (QDomNodePrivate *)0x0) {
          in_RDI->last->next = in_RSI;
        }
        in_RSI->prev = in_RDI->last;
        if (in_RDI->first == (QDomNodePrivate *)0x0) {
          in_RDI->first = in_RSI;
        }
        in_RDI->last = in_RSI;
      }
      else if (in_RDX->next == (QDomNodePrivate *)0x0) {
        if (in_RDI->last != (QDomNodePrivate *)0x0) {
          in_RDI->last->next = in_RSI;
        }
        in_RSI->prev = in_RDI->last;
        if (in_RDI->first == (QDomNodePrivate *)0x0) {
          in_RDI->first = in_RSI;
        }
        in_RDI->last = in_RSI;
      }
      else {
        in_RSI->prev = in_RDX;
        in_RSI->next = in_RDX->next;
        in_RDX->next->prev = in_RSI;
        in_RDX->next = in_RSI;
      }
    }
  }
  else {
    local_8 = (QDomNodePrivate *)0x0;
  }
  return local_8;
}

Assistant:

QDomNodePrivate* QDomNodePrivate::insertAfter(QDomNodePrivate* newChild, QDomNodePrivate* refChild)
{
    // Error check
    if (!newChild)
        return nullptr;

    // Error check
    if (newChild == refChild)
        return nullptr;

    // Error check
    if (refChild && refChild->parent() != this)
        return nullptr;

    // "mark lists as dirty"
    QDomDocumentPrivate *const doc = ownerDocument();
    if (doc)
        doc->nodeListTime++;

    // Special handling for inserting a fragment. We just insert
    // all elements of the fragment instead of the fragment itself.
    if (newChild->isDocumentFragment()) {
        // Fragment is empty ?
        if (newChild->first == nullptr)
            return newChild;

        // New parent
        QDomNodePrivate* n = newChild->first;
        while (n) {
            n->setParent(this);
            n = n->next;
        }

        // Insert at the end
        if (!refChild || refChild->next == nullptr) {
            if (last)
                last->next = newChild->first;
            newChild->first->prev = last;
            if (!first)
                first = newChild->first;
            last = newChild->last;
        } else { // Insert in the middle
            newChild->first->prev = refChild;
            newChild->last->next = refChild->next;
            refChild->next->prev = newChild->last;
            refChild->next = newChild->first;
        }

        // No need to increase the reference since QDomDocumentFragment
        // does not decrease the reference.

        // Remove the nodes from the fragment
        newChild->first = nullptr;
        newChild->last = nullptr;
        return newChild;
    }

    // Release new node from its current parent
    if (newChild->parent())
        newChild->parent()->removeChild(newChild);

    // No more errors can occur now, so we take
    // ownership of the node
    newChild->ref.ref();

    newChild->setParent(this);

    // Insert at the end
    if (!refChild) {
        if (last)
            last->next = newChild;
        newChild->prev = last;
        if (!first)
            first = newChild;
        last = newChild;
        return newChild;
    }

    if (refChild->next == nullptr) {
        if (last)
            last->next = newChild;
        newChild->prev = last;
        if (!first)
            first = newChild;
        last = newChild;
        return newChild;
    }

    newChild->prev = refChild;
    newChild->next = refChild->next;
    refChild->next->prev = newChild;
    refChild->next = newChild;

    return newChild;
}